

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

wchar_t div_u16n(uint16_t *q,uint16_t *r,uint16_t *w,uint16_t *num,uint16_t *den,size_t nq,size_t n,
                size_t nd)

{
  ulong uVar1;
  uint16_t *a;
  _Bool _Var2;
  wchar_t wVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint16_t uVar12;
  uint uVar13;
  uint16_t local_94;
  uint16_t local_92;
  ulong local_90;
  size_t local_88;
  uint16_t *local_80;
  uint16_t *local_78;
  uint16_t *local_70;
  size_t local_68;
  ulong local_60;
  uint16_t *local_58;
  long local_50;
  size_t local_48;
  long local_40;
  long local_38;
  
  local_78 = den;
  local_58 = q;
  sVar4 = msb_u16n(den,nd);
  if (sVar4 == 0) {
    wVar3 = L'\x02';
  }
  else {
    uVar5 = msb_u16n(num,n);
    local_60 = 1;
    if (sVar4 < uVar5) {
      local_60 = (uVar5 - sVar4) + 0xf >> 4;
    }
    if (n != 0) {
      sVar6 = 0;
      do {
        r[sVar6] = num[sVar6];
        sVar6 = sVar6 + 1;
      } while (n != sVar6);
    }
    local_90 = nq;
    if (nq < local_60) {
      local_90 = local_60;
    }
    if (local_90 != 0) {
      local_38 = local_90 << 4;
      lVar11 = sVar4 - 0x10;
      sVar4 = nd + 1;
      local_40 = n + 1;
      local_88 = sVar4;
      local_80 = w;
      local_70 = r;
      local_50 = lVar11;
      local_48 = nq;
      do {
        uVar1 = local_38 + lVar11;
        if (uVar5 < uVar1) {
          if (local_90 <= nq) {
            local_58[nq - local_90] = 0;
          }
        }
        else {
          uVar7 = (uVar5 + 1) - uVar1;
          if (0xf < uVar7) {
            uVar7 = 0x10;
          }
          uVar10 = 1 << ((byte)uVar7 & 0x1f);
          if (uVar5 + 1 == uVar1) {
            __assert_fail("lo < hi - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x541,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
          uVar8 = uVar10 >> 1;
          local_94 = (uint16_t)uVar8;
          _Var2 = mul_u16n(w,local_78,&local_94,sVar4,nd,1);
          if (_Var2) {
LAB_001fb5e3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x548,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
          local_68 = local_40 - local_90;
          uVar9 = 0;
LAB_001fb471:
          uVar12 = (uint16_t)uVar8;
          wVar3 = cmp_u16n(local_70,w,local_68,sVar4);
          w = local_80;
          sVar4 = local_88;
          if (L'\xffffffff' < wVar3) {
            if ((wVar3 == L'\0') || (uVar13 = uVar8 & 0xffff, uVar9 = uVar8, uVar10 - 1 == uVar13))
            goto LAB_001fb55c;
LAB_001fb4b6:
            uVar8 = uVar13 + uVar10 >> 1;
            local_94 = (uint16_t)uVar8;
            _Var2 = mul_u16n(local_80,local_78,&local_94,local_88,nd,1);
            if (_Var2) goto LAB_001fb5e3;
            goto LAB_001fb471;
          }
          uVar10 = uVar8 & 0xffff;
          uVar13 = uVar9 & 0xffff;
          if (uVar10 - 1 != uVar13) goto LAB_001fb4b6;
          local_92 = (uint16_t)uVar9;
          _Var2 = mul_u16n(local_80,local_78,&local_92,local_88,nd,1);
          if (_Var2) {
            __assert_fail("!over",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x556,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
          wVar3 = cmp_u16n(local_70,w,local_68,sVar4);
          uVar12 = (uint16_t)uVar9;
          if (wVar3 < L'\0') {
            __assert_fail("cmp_u16n(r, w, n - (iqr - 1), nd + 1) >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x558,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
LAB_001fb55c:
          nq = local_48;
          a = local_70;
          w = local_80;
          sVar4 = local_88;
          if (local_90 <= local_48) {
            local_58[local_48 - local_90] = uVar12;
          }
          subip_u16n(local_70,local_80,local_68,local_88);
          uVar5 = msb_u16n(a,n);
          lVar11 = local_50;
        }
        local_38 = local_38 + -0x10;
        local_90 = local_90 - 1;
      } while (local_90 != 0);
    }
    wVar3 = (wchar_t)(nq < local_60);
  }
  return wVar3;
}

Assistant:

static int div_u16n(uint16_t *q, uint16_t *r, uint16_t *w, const uint16_t *num,
		const uint16_t *den, size_t nq, size_t n, size_t nd)
{
	size_t msb_d = msb_u16n(den, nd), msb_r;
	size_t nqu, ir, iqr, iqrb;

	if (msb_d == 0) {
		return 2;
	}
	msb_r = msb_u16n(num, n);
	if (msb_r > msb_d) {
		nqu = ((msb_r - msb_d) + 15) / 16;
	} else {
		nqu = 1;
	}

	for (ir = 0; ir < n; ++ir) {
		r[ir] = num[ir];
	}

	for (iqr = MAX(nq, nqu), iqrb = MAX(nq, nqu) * 16; iqr > 0;
			--iqr, iqrb -= 16) {
		uint16_t lo;
		uint32_t hi;
		bool redo_w;

		if (msb_d + iqrb - 16 > msb_r) {
			if (iqr <= nq) {
				q[nq - iqr] = 0;
			}
			continue;
		}
		/* Use binary search to determine the digit in the quotient. */
		lo = 0;
		hi = (uint32_t)1 << MIN(16, (msb_r - msb_d  + 1 - (iqrb - 16)));
		redo_w = true;
		assert (lo < hi - 1);
		while (1) {
			uint16_t try = (uint16_t)((lo + hi) / 2);
			bool over = mul_u16n(w, den, &try, nd + 1, nd, 1);
			int c;

			if (over) {
				assert(0);
			}
			c = cmp_u16n(r, w, n - (iqr - 1), nd + 1);
			if (c < 0) {
				hi = try;
				redo_w = true;
			} else {
				lo = try;
				redo_w = false;
			}
			if (!c || lo == hi - 1) {
				if (redo_w) {
					over = mul_u16n(w, den, &lo, nd + 1,
						nd, 1);
					assert(!over);
					assert(cmp_u16n(r, w, n - (iqr - 1),
						nd + 1) >= 0);
				}
				if (iqr <= nq) {
					q[nq - iqr] = lo;
				}
				subip_u16n(r, w, n - (iqr - 1), nd + 1);
				msb_r = msb_u16n(r, n);
				break;
			}
		}
	}
	return (nqu > nq) ? 1 : 0;
}